

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::fixPosIncludesFrame(QWidgetPrivate *this)

{
  QWExtra *pQVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ushort uVar6;
  long lVar7;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var8;
  int iVar9;
  int iVar10;
  
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 == (QWExtra *)0x0) {
    _Var8._M_head_impl = (QTLWExtra *)0x0;
  }
  else {
    _Var8._M_head_impl =
         *(QTLWExtra **)
          &(pQVar1->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
    ;
  }
  if ((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var8._M_head_impl ==
      (QTLWExtra *)0x0) {
    return;
  }
  uVar6 = (ushort)*(uint *)((long)_Var8._M_head_impl + 0xe0);
  if ((*(uint *)((long)_Var8._M_head_impl + 0xe0) >> 8 & 1) == 0) {
    return;
  }
  lVar2 = *(long *)&this->field_0x8;
  lVar7 = *(long *)(lVar2 + 8);
  if ((*(byte *)(lVar7 + 0x248) & 0x80) == 0) {
    lVar7 = *(long *)(lVar7 + 0x78);
    if (lVar7 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = *(long *)(lVar7 + 8);
    }
    if (lVar7 == 0) {
      return;
    }
    if (*(long *)(lVar7 + 0x20) == 0) {
      return;
    }
    lVar7 = QWindow::handle();
    if (lVar7 == 0) {
      return;
    }
    updateFrameStrut(this);
    if ((*(byte *)(*(long *)(lVar2 + 0x20) + 0x11) & 0x10) != 0) {
      return;
    }
    iVar9 = (int)*(undefined8 *)((long)_Var8._M_head_impl + 0x90);
    iVar10 = (int)((ulong)*(undefined8 *)((long)_Var8._M_head_impl + 0x90) >> 0x20);
    iVar3 = (this->data).crect.y1.m_i;
    iVar4 = (this->data).crect.x2.m_i;
    iVar5 = (this->data).crect.y2.m_i;
    (this->data).crect.x1.m_i = (this->data).crect.x1.m_i + iVar9;
    (this->data).crect.y1.m_i = iVar3 + iVar10;
    (this->data).crect.x2.m_i = iVar4 + iVar9;
    (this->data).crect.y2.m_i = iVar5 + iVar10;
    uVar6 = *(ushort *)((long)_Var8._M_head_impl + 0xe0);
  }
  *(ushort *)((long)_Var8._M_head_impl + 0xe0) = uVar6 & 0xfeff;
  return;
}

Assistant:

void QWidgetPrivate::fixPosIncludesFrame()
{
    Q_Q(QWidget);
    if (QTLWExtra *te = maybeTopData()) {
        if (te->posIncludesFrame) {
            // For Qt::WA_DontShowOnScreen, assume a frame of 0 (for
            // example, in QGraphicsProxyWidget).
            if (q->testAttribute(Qt::WA_DontShowOnScreen)) {
                te->posIncludesFrame = 0;
            } else {
                if (q->windowHandle() && q->windowHandle()->handle()) {
                    updateFrameStrut();
                    if (!q->data->fstrut_dirty) {
                        data.crect.translate(te->frameStrut.x(), te->frameStrut.y());
                        te->posIncludesFrame = 0;
                    }
                } // windowHandle()
            } // !WA_DontShowOnScreen
        } // posIncludesFrame
    } // QTLWExtra
}